

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intInter.c
# Opt level: O0

void Inter_ManVerifyInterpolant1(Inta_Man_t *pMan,Sto_Man_t *pCnf,Aig_Man_t *pInter)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pOther;
  Aig_Man_t *p;
  Aig_Man_t *pAVar3;
  int RetValue2;
  int RetValue1;
  Aig_Man_t *pInterC;
  Aig_Man_t *pUpper;
  Aig_Man_t *pLower;
  Aig_Man_t *pInter_local;
  Sto_Man_t *pCnf_local;
  Inta_Man_t *pMan_local;
  
  pOther = Inta_ManDeriveClauses(pMan,pCnf,1);
  p = Inta_ManDeriveClauses(pMan,pCnf,0);
  Aig_ManFlipFirstPo(p);
  pAVar3 = Inter_ManDupExpand(pInter,pOther);
  iVar1 = Inter_ManCheckContainment(pOther,pAVar3);
  Aig_ManStop(pAVar3);
  pAVar3 = Inter_ManDupExpand(pInter,p);
  iVar2 = Inter_ManCheckContainment(pAVar3,p);
  Aig_ManStop(pAVar3);
  if ((iVar1 != 0) && (iVar2 != 0)) {
    printf("Im is correct.\n");
  }
  if (iVar1 == 0) {
    printf("Property A => Im fails.\n");
  }
  if (iVar2 == 0) {
    printf("Property Im => !B fails.\n");
  }
  Aig_ManStop(pOther);
  Aig_ManStop(p);
  return;
}

Assistant:

void Inter_ManVerifyInterpolant1( Inta_Man_t * pMan, Sto_Man_t * pCnf, Aig_Man_t * pInter )
{
    extern Aig_Man_t * Inta_ManDeriveClauses( Inta_Man_t * pMan, Sto_Man_t * pCnf, int fClausesA );
    Aig_Man_t * pLower, * pUpper, * pInterC;
    int RetValue1, RetValue2;

    pLower = Inta_ManDeriveClauses( pMan, pCnf, 1 );
    pUpper = Inta_ManDeriveClauses( pMan, pCnf, 0 );
    Aig_ManFlipFirstPo( pUpper );

    pInterC = Inter_ManDupExpand( pInter, pLower );
    RetValue1 = Inter_ManCheckContainment( pLower, pInterC );
    Aig_ManStop( pInterC );

    pInterC = Inter_ManDupExpand( pInter, pUpper );
    RetValue2 = Inter_ManCheckContainment( pInterC, pUpper );
    Aig_ManStop( pInterC );
    
    if ( RetValue1 && RetValue2 )
        printf( "Im is correct.\n" );
    if ( !RetValue1 )
        printf( "Property A => Im fails.\n" );
    if ( !RetValue2 )
        printf( "Property Im => !B fails.\n" );

    Aig_ManStop( pLower );
    Aig_ManStop( pUpper );
}